

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  extensions extensions;
  extensions extensions_00;
  int iVar2;
  long size;
  index_type size_00;
  array<char,_256UL> buffer_1;
  array<char,_256UL> buffer;
  char local_4ab [3];
  undefined1 local_4a8 [32];
  undefined1 local_488 [40];
  _Elt_pointer puStack_460;
  _Map_pointer local_458;
  _Elt_pointer puStack_450;
  _Elt_pointer local_448;
  _Elt_pointer puStack_440;
  _Map_pointer local_438;
  undefined1 auStack_430 [8];
  parser<(anonymous_namespace)::yaml_output> local_428;
  parser<(anonymous_namespace)::yaml_output> local_338;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_238 [2];
  uint auStack_218 [122];
  
  if (argc < 2) {
    memset(local_238,0,0x100);
    local_428.singletons_._M_t.
    super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>,_true,_true>
          )(__uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
            )0x0;
    local_428.stack_.c.
    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_428.stack_.c.
    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_428.stack_.c.
    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_428.stack_.c.
    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_428.stack_.c.
    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_428.stack_.c.
    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_428.stack_.c.
    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_428.stack_.c.
    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_428.stack_.c.
    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    std::
    _Deque_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
    ::_M_initialize_map((_Deque_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
                         *)(auStack_430 + 8),0);
    pstore::json::parser<(anonymous_namespace)::yaml_output>::parser
              (&local_338,(yaml_output *)(auStack_430 + 8),extensions);
    std::
    deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
    ::~deque((deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
              *)(auStack_430 + 8));
    if ((*(uint *)(std::__cxx11::wstring::_M_construct + *(long *)(std::cin + -0x18)) & 7) == 0 &&
        local_338.error_._M_value == 0) {
      do {
        std::istream::read((char *)&std::cin,(long)local_238);
        size = _ifstream;
        if (_ifstream < 1) {
          size = 0;
        }
        pstore::gsl::details::extent_type<-1L>::extent_type
                  ((extent_type<_1L> *)(local_488 + 0x10),size);
        local_4a8._0_8_ = local_488._16_8_;
        local_4a8._8_8_ = local_238;
        pstore::json::parser<(anonymous_namespace)::yaml_output>::input<pstore::gsl::span<char,_1l>>
                  (&local_338,(span<char,__1L> *)local_4a8);
      } while ((*(uint *)(std::__cxx11::wstring::_M_construct + *(long *)(std::cin + -0x18)) & 7) ==
               0 && local_338.error_._M_value == 0);
    }
    pstore::json::parser<(anonymous_namespace)::yaml_output>::eof
              ((parser<(anonymous_namespace)::yaml_output> *)local_488);
    if ((parser<(anonymous_namespace)::yaml_output> *)local_488._8_8_ !=
        (parser<(anonymous_namespace)::yaml_output> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_);
    }
    if (((byte)std::__cxx11::wstring::_M_construct[*(long *)(std::cin + -0x18)] & 1) == 0) {
      if (local_338.error_._M_value == 0) {
        anon_unknown.dwarf_112f4::yaml_output::result((yaml_output *)(local_488 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n----\n",6);
        (*(code *)((__shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2> *)local_488._16_8_
                  )->_M_ptr[0x13]._vptr_value)(local_488._16_8_,&std::cout);
        local_4ab[0] = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_4ab,1);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._24_8_);
        }
        iVar2 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Parse error: ",0xd);
        (**(code **)(*(long *)local_338.error_._M_cat + 0x20))
                  (local_488 + 0x10,local_338.error_._M_cat,local_338.error_._M_value);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_488._16_8_,local_488._24_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," (Line ",7);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", column ",9);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
        if ((_Elt_pointer)local_488._16_8_ != (_Elt_pointer)(local_488 + 0x20)) {
          operator_delete((void *)local_488._16_8_,
                          (ulong)&(((__uniq_ptr_data<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>,_true,_true>
                                     *)local_488._32_8_)->
                                  super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
                                  )._M_t.
                                  super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
                                  .field_0x1);
        }
        iVar2 = 1;
      }
    }
    else {
      iVar2 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"There was an I/O error while reading.\n",0x26);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.string_._M_dataplus._M_p != &local_338.string_.field_2) {
      operator_delete(local_338.string_._M_dataplus._M_p,
                      local_338.string_.field_2._M_allocated_capacity + 1);
    }
    std::
    deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
    ::~deque((deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
              *)&local_338.callbacks_);
    std::
    stack<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>_>
    ::~stack(&local_338.stack_);
    if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
         )local_338.singletons_._M_t.
          super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
         )0x0) {
      operator_delete((void *)local_338.singletons_._M_t.
                              super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
                              .
                              super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
                              ._M_head_impl,0x68);
    }
  }
  else {
    std::ifstream::ifstream(local_238,argv[1],_S_in);
    memset(&local_338,0,0x100);
    local_488._16_8_ = (_Elt_pointer)0x0;
    local_488._24_8_ = (_Elt_pointer)0x0;
    local_488._32_8_ = (_Elt_pointer)0x0;
    puStack_460 = (_Elt_pointer)0x0;
    local_458 = (_Map_pointer)0x0;
    puStack_450 = (_Elt_pointer)0x0;
    local_448 = (_Elt_pointer)0x0;
    puStack_440 = (_Elt_pointer)0x0;
    local_438 = (_Map_pointer)0x0;
    auStack_430 = (undefined1  [8])0x0;
    std::
    _Deque_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
    ::_M_initialize_map((_Deque_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
                         *)(local_488 + 0x10),0);
    pstore::json::parser<(anonymous_namespace)::yaml_output>::parser
              ((parser<(anonymous_namespace)::yaml_output> *)(auStack_430 + 8),
               (yaml_output *)(local_488 + 0x10),extensions_00);
    std::
    deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
    ::~deque((deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
              *)(local_488 + 0x10));
    if ((*(uint *)((long)auStack_218 + (long)local_238[0]._vptr__Sp_counted_base[-3]) & 7) == 0 &&
        local_428.error_._M_value == none) {
      do {
        std::istream::read((char *)local_238,(long)&local_338);
        size_00 = local_238[0]._8_8_;
        if ((long)local_238[0]._8_8_ < 1) {
          size_00 = 0;
        }
        pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_4a8,size_00);
        local_488._0_8_ = local_4a8._0_8_;
        local_488._8_8_ = &local_338;
        pstore::json::parser<(anonymous_namespace)::yaml_output>::input<pstore::gsl::span<char,_1l>>
                  ((parser<(anonymous_namespace)::yaml_output> *)(auStack_430 + 8),
                   (span<char,__1L> *)local_488);
      } while ((*(uint *)((long)auStack_218 + (long)local_238[0]._vptr__Sp_counted_base[-3]) & 7) ==
               0 && local_428.error_._M_value == none);
    }
    pstore::json::parser<(anonymous_namespace)::yaml_output>::eof
              ((parser<(anonymous_namespace)::yaml_output> *)local_488);
    if ((parser<(anonymous_namespace)::yaml_output> *)local_488._8_8_ !=
        (parser<(anonymous_namespace)::yaml_output> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_);
    }
    if ((*(byte *)((long)auStack_218 + (long)local_238[0]._vptr__Sp_counted_base[-3]) & 1) == 0) {
      if (local_428.error_._M_value == none) {
        anon_unknown.dwarf_112f4::yaml_output::result((yaml_output *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n----\n",6);
        (**(code **)(*(long *)local_4a8._0_8_ + 0x98))(local_4a8._0_8_,&std::cout);
        local_4ab[0] = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_4ab,1);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a8._8_8_);
        }
        iVar2 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Parse error: ",0xd);
        (**(code **)(*(long *)local_428.error_._M_cat + 0x20))
                  (local_4a8,local_428.error_._M_cat,local_428.error_._M_value);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_4a8._0_8_,local_4a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," (Line ",7);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", column ",9);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_,
                          (ulong)((long)&((__shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>
                                           *)local_4a8._16_8_)->_M_ptr + 1));
        }
        iVar2 = 1;
      }
    }
    else {
      iVar2 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"There was an I/O error while reading.\n",0x26);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428.string_._M_dataplus._M_p != &local_428.string_.field_2) {
      operator_delete(local_428.string_._M_dataplus._M_p,
                      local_428.string_.field_2._M_allocated_capacity + 1);
    }
    std::
    deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
    ::~deque((deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
              *)&local_428.callbacks_);
    std::
    stack<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>_>
    ::~stack(&local_428.stack_);
    if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
         )local_428.singletons_._M_t.
          super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
         )0x0) {
      operator_delete((void *)local_428.singletons_._M_t.
                              super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
                              .
                              super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
                              ._M_head_impl,0x68);
    }
    std::ifstream::~ifstream(local_238);
  }
  return iVar2;
}

Assistant:

int main (int argc, char const * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;
    PSTORE_TRY {
        if (argc < 2) {
            exit_code = slurp (std::cin);
        } else {
            std::ifstream input (argv[1]);
            exit_code = slurp (input);
        }
    }
    // clang-format off
    PSTORE_CATCH (std::exception const & ex, { // clang-format on
        error_stream << PSTORE_NATIVE_TEXT ("Error: ") << pstore::utf::to_native_string (ex.what ())
                     << PSTORE_NATIVE_TEXT ('\n');
        exit_code = EXIT_FAILURE;
    })
    // clang-format off
    PSTORE_CATCH (..., { // clang-format on
        error_stream << PSTORE_NATIVE_TEXT ("Unknown exception.\n");
        exit_code = EXIT_FAILURE;
    })
    return exit_code;
}